

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  uint *puVar5;
  string prefix;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + name->_M_string_length);
  lVar3 = std::__cxx11::string::rfind((char)(string *)local_70,0x2e);
  if (lVar3 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      local_50[0] = local_70[0];
      cVar4 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(((this->tables_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                       _M_head_impl)->symbols_by_name_)._M_h,(key_type *)local_50);
      puVar5 = (uint *)((long)cVar4.
                              super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                              ._M_cur + 0x10);
      if (cVar4.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur == (__node_type *)0x0) {
        puVar5 = &(anonymous_namespace)::kNullSymbol;
      }
      if ((*puVar5 & 0xfffffff7) != 0) {
        bVar2 = true;
        goto LAB_002ba466;
      }
      lVar3 = std::__cxx11::string::rfind((char)(string *)local_70,0x2e);
    } while (lVar3 != -1);
  }
  if (this->underlay_ == (DescriptorPool *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = IsSubSymbolOfBuiltType(this->underlay_,name);
  }
LAB_002ba466:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return bVar2;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const std::string& name) const {
  std::string prefix = name;
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}